

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O0

int TIFFWriteDirectoryTagCheckedShort
              (TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir,uint16_t tag,uint16_t value)

{
  int iVar1;
  uint16_t local_26;
  uint16_t local_24;
  uint16_t local_22;
  uint16_t m;
  uint16_t value_local;
  TIFFDirEntry *pTStack_20;
  uint16_t tag_local;
  TIFFDirEntry *dir_local;
  uint32_t *ndir_local;
  TIFF *tif_local;
  
  local_26 = value;
  local_24 = value;
  local_22 = tag;
  pTStack_20 = dir;
  dir_local = (TIFFDirEntry *)ndir;
  ndir_local = (uint32_t *)tif;
  if ((tif->tif_flags & 0x80) != 0) {
    TIFFSwabShort(&local_26);
  }
  iVar1 = TIFFWriteDirectoryTagData
                    ((TIFF *)ndir_local,(uint32_t *)dir_local,pTStack_20,local_22,3,1,2,&local_26);
  return iVar1;
}

Assistant:

static int TIFFWriteDirectoryTagCheckedShort(TIFF *tif, uint32_t *ndir,
                                             TIFFDirEntry *dir, uint16_t tag,
                                             uint16_t value)
{
    uint16_t m;
    assert(sizeof(uint16_t) == 2);
    m = value;
    if (tif->tif_flags & TIFF_SWAB)
        TIFFSwabShort(&m);
    return (
        TIFFWriteDirectoryTagData(tif, ndir, dir, tag, TIFF_SHORT, 1, 2, &m));
}